

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

void chmgr_handler(chmgr *chmgr,uint8_t fn,uint16_t len,uint8_t *buf)

{
  uint8_t *buf_local;
  uint16_t len_local;
  uint8_t fn_local;
  chmgr *chmgr_local;
  
  switch(fn) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1b':
  case '\x1c':
  case '\x1d':
  case '\x1e':
    handle_logical_mgr(chmgr,fn,buf,len);
    break;
  case ' ':
  case '!':
  case '\"':
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case ',':
  case '-':
  case '.':
  case '/':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
    handle_blk_seq(chmgr,fn,buf,len);
    break;
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
    handle_blk_aeq(chmgr,fn,*buf,buf + 1);
    break;
  case 0x80:
    handle_fstat_req(chmgr,buf,len);
    break;
  case 0x81:
    handle_fstat_rsp(chmgr,*buf);
    break;
  case 0x82:
    handle_blk_comp(chmgr);
    break;
  case 0x83:
    handle_heartbeat(chmgr);
    break;
  case 0x84:
  }
  return;
}

Assistant:

static void chmgr_handler(struct chmgr *chmgr, uint8_t fn, uint16_t len, const uint8_t *buf)
{
    //if(fn != CTRL_HEARTBEAT && fn != CTRL_HEARTBEAT_ACK)
    //    LOGD("%s: %02x\n", __func__, fn);
    switch(fn) {
    case CTRL_HEARTBEAT_ACK: break;
    case CTRL_HEARTBEAT     : handle_heartbeat(chmgr); break;

    case CTRL_FSTAT_REQ     : handle_fstat_req(chmgr, buf, len); break;
    case CTRL_FSTAT_RSP     : handle_fstat_rsp(chmgr, buf[0]); break;
    case CTRL_BLK_COMP      : handle_blk_comp(chmgr); break;

    case CTRL_LOGICAL0 ... CTRL_LOGICAL30: handle_logical_mgr(chmgr, fn, buf, len); break;
    case CTRL_BLK_SEQ0 ... CTRL_BLK_SEQ31: handle_blk_seq(chmgr, fn, buf, len);break;
    case CTRL_BLK_AEQ0 ... CTRL_BLK_AEQ31: handle_blk_aeq(chmgr, fn, buf[0], buf + 1);break;
    }
}